

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

Ptr __thiscall r_comp::RepliStruct::loadReplicodeFile(RepliStruct *this,string *filename)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  uint64_t b;
  uint64_t a;
  string oldFile;
  ifstream loadStream;
  undefined4 uStack_22c;
  byte abStack_210 [488];
  
  uVar1 = GlobalLine;
  std::__cxx11::string::string((string *)&oldFile,(string *)&GlobalFilename_abi_cxx11_);
  GlobalLine = 1;
  std::__cxx11::string::_M_assign((string *)&GlobalFilename_abi_cxx11_);
  _loadStream = 0;
  std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>(&this->type);
  std::ifstream::ifstream(&loadStream,(in_RDX->_M_dataplus)._M_p,_S_in);
  if ((abStack_210[*(long *)(CONCAT44(uStack_22c,_loadStream) + -0x18)] & 7) == 0) {
    a = 0;
    b = 0;
    parse(*(RepliStruct **)this,(istream *)&loadStream,&a,&b,0);
    if ((abStack_210[*(long *)(CONCAT44(uStack_22c,_loadStream) + -0x18)] & 2) == 0) {
      std::__cxx11::string::assign((char *)(*(long *)this + 0x68));
    }
    std::ifstream::close();
    GlobalLine = (long)(int)uVar1;
    std::__cxx11::string::_M_assign((string *)&GlobalFilename_abi_cxx11_);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                   "Load: File \'",in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                   "\' cannot be read! ");
    std::__cxx11::string::append((string *)(*(long *)this + 0x68));
    std::__cxx11::string::~string((string *)&a);
    std::__cxx11::string::~string((string *)&b);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&loadStream);
  std::__cxx11::string::~string((string *)&oldFile);
  PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar2.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliStruct::loadReplicodeFile(const std::string &filename)
{
    int oldLine = GlobalLine;
    std::string oldFile = GlobalFilename;
    GlobalLine = 1;
    GlobalFilename = filename;
    RepliStruct::Ptr newRoot = std::make_shared<RepliStruct>(Root);
    std::ifstream loadStream(filename.c_str());

    if (loadStream.bad() || loadStream.fail() || loadStream.eof()) {
        newRoot->error += "Load: File '" + filename + "' cannot be read! ";
        loadStream.close();
        return newRoot;
    }

    // create new Root structure
    uint64_t a = 0, b = 0;

    if (newRoot->parse(&loadStream, a, b) < 0) {
        // error is already recorded in newRoot
    }

    if (!loadStream.eof()) {
        newRoot->error = "Code structure error: Unmatched ) or ].\n";
    }

    loadStream.close();
    GlobalLine = oldLine;
    GlobalFilename = oldFile;
    return newRoot;
}